

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::compileExpression(SelectionCompiler *this,int itoken)

{
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *this_00;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *__x;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  this_00 = &this->ltokenPostfix;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::clear(this_00);
  __x = &this->atokenCommand;
  lVar3 = 0;
  uVar2 = 0;
  if (0 < itoken) {
    uVar2 = (ulong)(uint)itoken;
  }
  for (; uVar2 * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
              (this_00,(value_type *)
                       ((long)&((__x->
                                super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>).
                                _M_impl.super__Vector_impl_data._M_start)->tok + lVar3));
  }
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=(&this->atokenInfix,__x);
  this->itokenInfix = (long)itoken;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
            (this_00,(value_type *)Token::tokenExpressionBegin);
  bVar1 = clauseOr(this);
  if (bVar1) {
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
              (this_00,(value_type *)Token::tokenExpressionEnd);
    if (this->itokenInfix !=
        ((long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x18) {
      bVar1 = endOfExpressionExpected(this);
      return bVar1;
    }
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=(__x,this_00);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SelectionCompiler::compileExpression(int itoken) {
    ltokenPostfix.clear();
    for (int i = 0; i < itoken; ++i) {
      addTokenToPostfix(atokenCommand[i]);
    }

    atokenInfix = atokenCommand;
    itokenInfix = itoken;

    addTokenToPostfix(Token::tokenExpressionBegin);
    if (!clauseOr()) { return false; }

    addTokenToPostfix(Token::tokenExpressionEnd);
    if (itokenInfix != atokenInfix.size()) { return endOfExpressionExpected(); }

    atokenCommand = ltokenPostfix;
    return true;
  }